

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensors.cpp
# Opt level: O1

bool __thiscall
iDynTree::SensorsList::setSerialization
          (SensorsList *this,SensorType *sensor_type,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *serializaton)

{
  pointer pvVar1;
  bool bVar2;
  Sensor *pSVar3;
  ostream *poVar4;
  pointer pbVar5;
  long lVar6;
  size_type __n;
  ulong uVar7;
  bool bVar8;
  vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_> newVecSensors;
  ptrdiff_t local_50;
  vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_> local_48;
  
  __n = (long)(serializaton->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(serializaton->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start >> 5;
  pvVar1 = (this->pimpl->allSensors).
           super__Vector_base<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (__n == (long)*(pointer *)
                    ((long)&pvVar1[*sensor_type].
                            super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>
                            ._M_impl + 8) -
             *(long *)&pvVar1[*sensor_type].
                       super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>.
                       _M_impl >> 3) {
    std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>::vector
              (&local_48,__n,(allocator_type *)&local_50);
    pbVar5 = (serializaton->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    bVar8 = (serializaton->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish == pbVar5;
    if (!bVar8) {
      lVar6 = 0;
      uVar7 = 0;
      do {
        bVar2 = getSensorIndex(this,sensor_type,
                               (string *)((long)&(pbVar5->_M_dataplus)._M_p + lVar6),&local_50);
        if (!bVar2) {
          local_50 = -1;
        }
        if (local_50 == -1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"[ERROR] SensorsTree::setSerialization error : sensor ",
                     0x35);
          pbVar5 = (serializaton->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,
                              *(char **)((long)&(pbVar5->_M_dataplus)._M_p + lVar6),
                              *(long *)((long)&pbVar5->_M_string_length + lVar6));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4," not found in sensor list.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          goto LAB_001669ff;
        }
        pSVar3 = getSensor(this,sensor_type,local_50);
        local_48.super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>._M_impl
        .super__Vector_impl_data._M_start[uVar7] = pSVar3;
        uVar7 = uVar7 + 1;
        pbVar5 = (serializaton->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar6 = lVar6 + 0x20;
        bVar2 = uVar7 < (ulong)((long)(serializaton->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >>
                               5);
        bVar8 = !bVar2;
      } while (bVar2);
    }
    std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>::operator=
              ((this->pimpl->allSensors).
               super__Vector_base<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + *sensor_type,&local_48);
LAB_001669ff:
    if (local_48.super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "[ERROR] SensorsTree::setSerialization error : wrong size of serializaton vector",
               0x4f);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool SensorsList::setSerialization(const SensorType& sensor_type,
                                   const std::vector< std::string >& serializaton)
{
    if( serializaton.size() != this->getNrOfSensors(sensor_type) )
    {
         std::cerr << "[ERROR] SensorsTree::setSerialization error : wrong size of serializaton vector" << std::endl;
         return false;
    }

    std::vector<Sensor *> newVecSensors(serializaton.size());

    for(size_t i=0; i < serializaton.size(); i++ )
    {
        std::ptrdiff_t oldSensIndex = getSensorIndex(sensor_type,serializaton[i]);
        if( oldSensIndex == -1 )
        {
            std::cerr << "[ERROR] SensorsTree::setSerialization error : sensor " << serializaton[i] << " not found in sensor list." << std::endl;
            return false;
        }
        newVecSensors[i] = this->getSensor(sensor_type,oldSensIndex);
    }

    this->pimpl->allSensors[sensor_type] = newVecSensors;

    return true;
}